

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

void __thiscall dxil_spv::SPIRVModule::Impl::build_discard_call_early_cond(Impl *this,Id cond)

{
  Builder *this_00;
  Block *pBVar1;
  Id IVar2;
  Function *pFVar3;
  Block *this_01;
  Block *this_02;
  Id local_74;
  Block *entry;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this_00 = &this->builder;
  pBVar1 = (this->builder).buildPoint;
  pFVar3 = this->discard_function_cond;
  if (pFVar3 == (Function *)0x0) {
    entry = (Block *)0x0;
    IVar2 = spv::Builder::makeVoidType(this_00);
    local_74 = spv::Builder::makeBoolType(this_00);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_48,
               &local_74);
    local_68.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar3 = spv::Builder::makeFunctionEntry
                       (this_00,DecorationMax,IVar2,"discard_cond",(Vector<Id> *)&local_48,&local_68
                        ,&entry);
    this->discard_function_cond = pFVar3;
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_68);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               &local_48);
    this_01 = (Block *)allocate_in_thread(0x78);
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    spv::Block::Block(this_01,IVar2,this->discard_function_cond);
    this_02 = (Block *)allocate_in_thread(0x78);
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    spv::Block::Block(this_02,IVar2,this->discard_function_cond);
    (this->builder).buildPoint = entry;
    spv::Builder::createSelectionMerge(this_00,this_02,0);
    spv::Builder::createConditionalBranch
              (this_00,(*(this->discard_function_cond->parameterInstructions).
                         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)->resultId,this_01,this_02);
    (this->builder).buildPoint = this_01;
    IVar2 = spv::Builder::makeBoolConstant(this_00,true,false);
    spv::Builder::createStore(this_00,IVar2,this->discard_state_var_id);
    spv::Builder::createBranch(this_00,this_02);
    (this->builder).buildPoint = this_02;
    spv::Builder::makeReturn(this_00,false,0);
    pFVar3 = this->discard_function_cond;
  }
  (this->builder).buildPoint = pBVar1;
  local_68.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_68.
                         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,cond);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_48,
             &local_68);
  spv::Builder::createFunctionCall(this_00,pFVar3,(Vector<spv::Id> *)&local_48);
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&local_48)
  ;
  return;
}

Assistant:

void SPIRVModule::Impl::build_discard_call_early_cond(spv::Id cond)
{
	auto *current_build_point = builder.getBuildPoint();

	if (!discard_function_cond)
	{
		spv::Block *entry = nullptr;
		discard_function_cond =
			builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(), "discard_cond",
			                          { builder.makeBoolType() }, {}, &entry);

		auto *true_block = new spv::Block(builder.getUniqueId(), *discard_function_cond);
		auto *false_block = new spv::Block(builder.getUniqueId(), *discard_function_cond);
		builder.setBuildPoint(entry);
		builder.createSelectionMerge(false_block, 0);
		builder.createConditionalBranch(discard_function_cond->getParamId(0), true_block, false_block);
		builder.setBuildPoint(true_block);
		builder.createStore(builder.makeBoolConstant(true), discard_state_var_id);
		builder.createBranch(false_block);
		builder.setBuildPoint(false_block);
		builder.makeReturn(false);
	}

	builder.setBuildPoint(current_build_point);
	builder.createFunctionCall(discard_function_cond, { cond });
}